

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

int Rml::Math::HexToDecimal(char hex_digit)

{
  undefined4 local_c;
  char hex_digit_local;
  
  if ((hex_digit < '0') || ('9' < hex_digit)) {
    if ((hex_digit < 'a') || ('f' < hex_digit)) {
      if ((hex_digit < 'A') || ('F' < hex_digit)) {
        local_c = -1;
      }
      else {
        local_c = hex_digit + -0x37;
      }
    }
    else {
      local_c = hex_digit + -0x57;
    }
  }
  else {
    local_c = hex_digit + -0x30;
  }
  return local_c;
}

Assistant:

RMLUICORE_API int HexToDecimal(char hex_digit)
	{
		if (hex_digit >= '0' && hex_digit <= '9')
			return hex_digit - '0';
		else if (hex_digit >= 'a' && hex_digit <= 'f')
			return 10 + (hex_digit - 'a');
		else if (hex_digit >= 'A' && hex_digit <= 'F')
			return 10 + (hex_digit - 'A');

		return -1;
	}